

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.cpp
# Opt level: O0

int forward(socket_base_t *from_,zmq_socket_stats_t *from_stats_,socket_base_t *to_,
           zmq_socket_stats_t *to_stats_,socket_base_t *capture_,msg_t *msg_)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  size_t in_RCX;
  socket_base_t *in_RDX;
  void *__buf;
  long *in_RSI;
  socket_base_t *in_RDI;
  int in_R8D;
  undefined4 in_register_00000084;
  socklen_t *in_R9;
  int rc;
  size_t complete_msg_size;
  size_t moresz;
  int more;
  uint i;
  long local_50;
  msg_t *in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_3c;
  socklen_t *local_38;
  size_t local_28;
  socket_base_t *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_3c = 0;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  do {
    if (999 < local_3c) {
      return 0;
    }
    local_50 = 0;
    do {
      sVar2 = zmq::socket_base_t::recv(in_RDI,(int)local_38,(void *)0x1,in_RCX,in_R8D);
      if ((int)sVar2 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 0xb || local_3c == 0) {
          return -1;
        }
        return 0;
      }
      sVar4 = zmq::msg_t::size(in_stack_ffffffffffffffb8);
      local_50 = sVar4 + local_50;
      in_stack_ffffffffffffffb8 = (msg_t *)0x4;
      iVar1 = zmq::socket_base_t::getsockopt
                        (in_RDI,0xd,(int)&local_40,(int)&stack0xffffffffffffffb8,
                         (void *)CONCAT44(in_register_00000084,in_R8D),in_R9);
      if (iVar1 < 0) {
        return -1;
      }
      iVar1 = capture((socket_base_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                      ,(msg_t *)in_RDI,(int)((ulong)in_RSI >> 0x20));
      if (iVar1 < 0) {
        return -1;
      }
      in_RCX = (size_t)local_40;
      __buf = (void *)0x0;
      if (local_40 != 0) {
        __buf = (void *)0x2;
      }
      sVar2 = zmq::socket_base_t::send(local_20,(int)local_38,__buf,in_RCX,in_R8D);
      if ((int)sVar2 < 0) {
        return -1;
      }
    } while (local_40 != 0);
    *in_RSI = *in_RSI + 1;
    in_RSI[1] = local_50 + in_RSI[1];
    *(long *)(local_28 + 0x10) = *(long *)(local_28 + 0x10) + 1;
    in_RCX = local_50 + *(long *)(local_28 + 0x18);
    *(size_t *)(local_28 + 0x18) = in_RCX;
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static int forward (class zmq::socket_base_t *from_,
                    zmq_socket_stats_t *from_stats_,
                    class zmq::socket_base_t *to_,
                    zmq_socket_stats_t *to_stats_,
                    class zmq::socket_base_t *capture_,
                    zmq::msg_t *msg_)
{
    // Forward a burst of messages
    for (unsigned int i = 0; i < zmq::proxy_burst_size; i++) {
        int more;
        size_t moresz;
        size_t complete_msg_size = 0;

        // Forward all the parts of one message
        while (true) {
            int rc = from_->recv (msg_, ZMQ_DONTWAIT);
            if (rc < 0) {
                if (likely (errno == EAGAIN && i > 0))
                    return 0; // End of burst

                return -1;
            }

            complete_msg_size += msg_->size ();

            moresz = sizeof more;
            rc = from_->getsockopt (ZMQ_RCVMORE, &more, &moresz);
            if (unlikely (rc < 0))
                return -1;

            //  Copy message to capture socket if any
            rc = capture (capture_, msg_, more);
            if (unlikely (rc < 0))
                return -1;

            rc = to_->send (msg_, more ? ZMQ_SNDMORE : 0);
            if (unlikely (rc < 0))
                return -1;

            if (more == 0)
                break;
        }

        // A multipart message counts as 1 packet:
        from_stats_->msg_in++;
        from_stats_->bytes_in += complete_msg_size;
        to_stats_->msg_out++;
        to_stats_->bytes_out += complete_msg_size;
    }

    return 0;
}